

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_wString __thiscall
ON_SubDComponentId::ToString
          (ON_SubDComponentId *this,bool bUnsetIsEmptyString,bool bDirectionPrefix)

{
  byte bVar1;
  uint uVar2;
  Type TVar3;
  bool bVar4;
  uint uVar5;
  char in_CL;
  undefined7 in_register_00000031;
  ON_SubDComponentId *this_00;
  ulong uVar6;
  ON_wString str;
  ON_SubDFaceCornerDex cdex;
  ON_wString OStack_48;
  ON_wString local_40;
  ON_SubDFaceCornerDex local_34;
  
  this_00 = (ON_SubDComponentId *)CONCAT71(in_register_00000031,bUnsetIsEmptyString);
  ON_wString::ON_wString(&local_40);
  uVar2 = this_00->m_id;
  if (uVar2 != 0) {
    bVar1 = this_00->m_type_and_dir;
    TVar3 = ComponentType(this_00);
    uVar6 = (ulong)((bVar1 & 1) * 2 + 0x2b);
    if (TVar3 == Vertex) {
      if (in_CL == '\0') {
        ON_wString::FormatToString((wchar_t *)&OStack_48,L"v%u",(ulong)uVar2);
      }
      else {
        ON_wString::FormatToString((wchar_t *)&OStack_48,L"%cv%u",uVar6,(ulong)uVar2);
      }
      ON_wString::operator=(&local_40,&OStack_48);
    }
    else if (TVar3 == Edge) {
      if (in_CL == '\0') {
        ON_wString::FormatToString((wchar_t *)&OStack_48,L"e%u",(ulong)uVar2);
      }
      else {
        ON_wString::FormatToString((wchar_t *)&OStack_48,L"%ce%u",uVar6,(ulong)uVar2);
      }
      ON_wString::operator=(&local_40,&OStack_48);
    }
    else {
      if (TVar3 != Face) goto LAB_005cdb2f;
      local_34 = FaceCornerDex(this_00);
      bVar4 = ON_SubDFaceCornerDex::IsSet(&local_34);
      if (bVar4) {
        if (in_CL == '\0') {
          uVar5 = ON_SubDFaceCornerDex::CornerIndex(&local_34);
          ON_wString::FormatToString((wchar_t *)&OStack_48,L"f%u.%u",(ulong)uVar2,(ulong)uVar5);
        }
        else {
          uVar5 = ON_SubDFaceCornerDex::CornerIndex(&local_34);
          ON_wString::FormatToString
                    ((wchar_t *)&OStack_48,L"%cf%u.%u",uVar6,(ulong)uVar2,(ulong)uVar5);
        }
        ON_wString::operator=(&local_40,&OStack_48);
      }
      else {
        if (in_CL == '\0') {
          ON_wString::FormatToString((wchar_t *)&OStack_48,L"f%u",(ulong)uVar2);
        }
        else {
          ON_wString::FormatToString((wchar_t *)&OStack_48,L"%cf%u",uVar6,(ulong)uVar2);
        }
        ON_wString::operator=(&local_40,&OStack_48);
      }
    }
    ON_wString::~ON_wString(&OStack_48);
  }
LAB_005cdb2f:
  bVar4 = ON_wString::IsNotEmpty(&local_40);
  if (bVar4 || bDirectionPrefix) {
    ON_wString::ON_wString((ON_wString *)this,&local_40);
  }
  else {
    ON_wString::ON_wString((ON_wString *)this,"unset");
  }
  ON_wString::~ON_wString(&local_40);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDComponentId::ToString(bool bUnsetIsEmptyString, bool bDirectionPrefix) const
{
  ON_wString str;
  const unsigned id = this->ComponentId();
  if (id > 0)
  {
    const char prefix = bDirectionPrefix ? (1 == this->ComponentDirection() ? '-' : '+') : 0;
    switch (this->ComponentType())
    {
    case ON_SubDComponentPtr::Type::Vertex:
      str = (0 == prefix) ? ON_wString::FormatToString(L"v%u", id) : ON_wString::FormatToString(L"%cv%u", prefix, id);
      break;

    case ON_SubDComponentPtr::Type::Edge:
      str = (0 == prefix) ? ON_wString::FormatToString(L"e%u", id) : ON_wString::FormatToString(L"%ce%u", prefix, id);
      break;

    case ON_SubDComponentPtr::Type::Face:
    {
      const ON_SubDFaceCornerDex cdex = this->FaceCornerDex();
      if (cdex.IsSet())
        str = (0 == prefix) ? ON_wString::FormatToString(L"f%u.%u", id, cdex.CornerIndex()) : ON_wString::FormatToString(L"%cf%u.%u", prefix, id, cdex.CornerIndex());
      else
        str = (0 == prefix) ? ON_wString::FormatToString(L"f%u", id) : ON_wString::FormatToString(L"%cf%u", prefix, id);
    }
    break;

    case ON_SubDComponentPtr::Type::Unset:
      break;
    }
  }
  return (str.IsNotEmpty() || bUnsetIsEmptyString) ? str : ON_wString("unset");
}